

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

AsmJsVarType Wasm::WasmToAsmJs::GetAsmJsVarType(WasmType wasmType)

{
  WasmCompilationException *this;
  AsmJsVarType local_11;
  WasmType local_10;
  AsmJsVarType asmType;
  WasmType wasmType_local;
  
  local_10 = wasmType;
  Js::AsmJsVarType::AsmJsVarType(&local_11,Int);
  switch(local_10) {
  case FirstLocalType:
    Js::AsmJsVarType::AsmJsVarType(&asmType,Int);
    break;
  case I64:
    Js::AsmJsVarType::AsmJsVarType(&asmType,Int64);
    break;
  case F32:
    Js::AsmJsVarType::AsmJsVarType(&asmType,Float);
    break;
  case F64:
    Js::AsmJsVarType::AsmJsVarType(&asmType,Double);
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    Js::AsmJsVarType::AsmJsVarType(&asmType,Float32x4);
    break;
  default:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this,L"Unknown var type %u",(ulong)local_10);
    __cxa_throw(this,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  return (AsmJsVarType)asmType.which_;
}

Assistant:

Js::AsmJsVarType WasmToAsmJs::GetAsmJsVarType(WasmTypes::WasmType wasmType)
{
    Js::AsmJsVarType asmType = Js::AsmJsVarType::Int;
    switch (wasmType)
    {
    case WasmTypes::I32: return Js::AsmJsVarType::Int;
    case WasmTypes::I64: return Js::AsmJsVarType::Int64;
    case WasmTypes::F32: return Js::AsmJsVarType::Float;
    case WasmTypes::F64: return Js::AsmJsVarType::Double;
#ifdef ENABLE_WASM_SIMD
    case WasmTypes::V128:
        Simd::EnsureSimdIsEnabled();
        return Js::AsmJsVarType::Float32x4;
#endif
    default:
        WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
        throw WasmCompilationException(_u("Unknown var type %u"), wasmType);
    }
}